

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlNodeDumpFile(void)

{
  int iVar1;
  int iVar2;
  FILE *val;
  xmlDocPtr val_00;
  xmlNodePtr val_01;
  int local_3c;
  int n_cur;
  xmlNodePtr cur;
  int n_doc;
  xmlDocPtr doc;
  int n_out;
  FILE *out;
  int mem_base;
  int test_ret;
  
  out._4_4_ = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 2; doc._4_4_ = doc._4_4_ + 1) {
    for (cur._4_4_ = 0; (int)cur._4_4_ < 4; cur._4_4_ = cur._4_4_ + 1) {
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_FILE_ptr(doc._4_4_,0);
        val_00 = gen_xmlDocPtr(cur._4_4_,1);
        val_01 = gen_xmlNodePtr(local_3c,2);
        htmlNodeDumpFile(val,val_00,val_01);
        call_tests = call_tests + 1;
        des_FILE_ptr(doc._4_4_,val,0);
        des_xmlDocPtr(cur._4_4_,val_00,1);
        des_xmlNodePtr(local_3c,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlNodeDumpFile",(ulong)(uint)(iVar2 - iVar1));
          out._4_4_ = out._4_4_ + 1;
          printf(" %d",(ulong)doc._4_4_);
          printf(" %d",(ulong)cur._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return out._4_4_;
}

Assistant:

static int
test_htmlNodeDumpFile(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED) && defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    FILE * out; /* the FILE pointer */
    int n_out;
    xmlDocPtr doc; /* the document */
    int n_doc;
    xmlNodePtr cur; /* the current node */
    int n_cur;

    for (n_out = 0;n_out < gen_nb_FILE_ptr;n_out++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_cur = 0;n_cur < gen_nb_xmlNodePtr;n_cur++) {
        mem_base = xmlMemBlocks();
        out = gen_FILE_ptr(n_out, 0);
        doc = gen_xmlDocPtr(n_doc, 1);
        cur = gen_xmlNodePtr(n_cur, 2);

        htmlNodeDumpFile(out, doc, cur);
        call_tests++;
        des_FILE_ptr(n_out, out, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        des_xmlNodePtr(n_cur, cur, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlNodeDumpFile",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out);
            printf(" %d", n_doc);
            printf(" %d", n_cur);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}